

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O0

bool __thiscall InputSource::fastRead(InputSource *this,char *ch)

{
  char *ch_local;
  InputSource *this_local;
  
  if (this->buf_idx < this->buf_len) {
    *ch = this->buffer[this->buf_idx];
    this->buf_idx = this->buf_idx + 1;
    this->last_offset = this->last_offset + 1;
    this_local._7_1_ = true;
  }
  else if (this->buf_len == 0) {
    this_local._7_1_ = false;
  }
  else {
    (*this->_vptr_InputSource[5])(this,this->buf_start + this->buf_len,0);
    fastTell(this);
    this_local._7_1_ = fastRead(this,ch);
  }
  return this_local._7_1_;
}

Assistant:

inline bool
InputSource::fastRead(char& ch)
{
    // Before calling fastRead, fastTell must be called to prepare the buffer. Once reading is
    // complete, fastUnread must be called to set the correct file position.
    if (buf_idx < buf_len) {
        ch = buffer[buf_idx];
        ++(buf_idx);
        ++(last_offset);
        return true;

    } else if (buf_len == 0) {
        return false;
    } else {
        seek(buf_start + buf_len, SEEK_SET);
        fastTell();
        return fastRead(ch);
    }
}